

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::extendModel(SimpSolver *this)

{
  uint index;
  bool bVar1;
  int iVar2;
  uint *puVar3;
  lbool *plVar4;
  uchar *in_RCX;
  size_t *siglen;
  uchar *sig;
  Solver *in_RDI;
  size_t in_R8;
  Lit x;
  int j;
  int i;
  lbool *in_stack_ffffffffffffffb8;
  vec<Minisat::lbool> *in_stack_ffffffffffffffc0;
  Lit in_stack_ffffffffffffffd0;
  lbool local_25;
  int local_24;
  lbool local_1d;
  int local_1c;
  uint8_t local_15;
  Lit local_14;
  uint local_10;
  uint local_c;
  
  iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)&in_RDI[1].step_size);
  local_c = iVar2 + -1;
  do {
    index = local_c;
    if ((int)local_c < 1) {
      return;
    }
    local_c = local_c - 1;
    puVar3 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)&in_RDI[1].step_size,index);
    for (local_10 = *puVar3; 1 < (int)local_10; local_10 = local_10 - 1) {
      puVar3 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)&in_RDI[1].step_size,local_c);
      local_1c = (int)toLit(*puVar3);
      local_15 = (uint8_t)Solver::modelValue(in_RDI,in_stack_ffffffffffffffd0);
      lbool::lbool(&local_1d,'\x01');
      bVar1 = lbool::operator!=(in_stack_ffffffffffffffb8,
                                (lbool)(uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x38));
      if (bVar1) goto LAB_0015b4bd;
      local_c = local_c - 1;
    }
    sig = (uchar *)(ulong)local_c;
    puVar3 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)&in_RDI[1].step_size,local_c);
    local_24 = (int)toLit(*puVar3);
    local_14 = (Lit)local_24;
    iVar2 = sign((EVP_PKEY_CTX *)(ulong)(uint)local_24,sig,siglen,in_RCX,in_R8);
    lbool::lbool(&local_25,(bool)(((byte)iVar2 ^ 0xff) & 1));
    in_stack_ffffffffffffffc0 = &in_RDI->model;
    in_stack_ffffffffffffffd0.x = local_14.x;
    iVar2 = var(local_14);
    plVar4 = vec<Minisat::lbool>::operator[](in_stack_ffffffffffffffc0,iVar2);
    plVar4->value = local_25.value;
LAB_0015b4bd:
    in_RCX = (uchar *)(ulong)local_10;
    local_c = local_c - local_10;
  } while( true );
}

Assistant:

void SimpSolver::extendModel()
{
    int i, j;
    Lit x;

    for (i = elimclauses.size() - 1; i > 0; i -= j) {
        for (j = elimclauses[i--]; j > 1; j--, i--)
            if (modelValue(toLit(elimclauses[i])) != l_False) goto next;

        x = toLit(elimclauses[i]);
        model[var(x)] = lbool(!sign(x));
    next:;
    }
}